

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O1

void asio::detail::
     reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ptr p;
  ptr local_68;
  read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
  local_50;
  scheduler_operation *local_20;
  error_category *peStack_18;
  size_t local_10;
  
  local_50.super_base_from_completion_cond<asio::detail::transfer_exactly_t>.completion_condition_.
  size_ = *(transfer_exactly_t *)&base[3].task_result_;
  local_68.h = &local_50;
  local_50.stream_ =
       (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *)
       base[4].next_;
  local_50.buffers_.sb_ = (basic_streambuf<std::allocator<char>_> *)base[4].func_;
  local_50.start_ = base[4].task_result_;
  local_50.total_transferred_ = (size_t)base[5].next_;
  local_50.handler_.this = (HTTPRequester *)base[5].func_;
  local_20 = base[1].next_;
  peStack_18 = (error_category *)base[1].func_;
  local_10 = *(size_t *)&base[1].task_result_;
  local_68.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)base;
  local_68.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)base;
  ptr::reset(&local_68);
  if (owner != (void *)0x0) {
    read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
    ::operator()(&local_50,(error_code *)&local_20,local_10,0);
  }
  ptr::reset(&local_68);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_recv_op* o(static_cast<reactive_socket_recv_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }